

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDebugNames::ValueIterator::searchFromStartOfCurrentIndex(ValueIterator *this)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  NameIndex *pNVar4;
  
  pNVar4 = this->CurrentIndex;
  uVar1 = (pNVar4->Section->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
          super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
          super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
          super_SmallVectorBase.Size;
  pvVar2 = (pNVar4->Section->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
           super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
           super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
           super_SmallVectorBase.BeginX;
  while( true ) {
    if (pNVar4 == (NameIndex *)((ulong)uVar1 * 0x98 + (long)pvVar2)) {
      setEnd(this);
      return;
    }
    bVar3 = findInCurrentIndex(this);
    if (bVar3) break;
    pNVar4 = this->CurrentIndex + 1;
    this->CurrentIndex = pNVar4;
  }
  return;
}

Assistant:

void DWARFDebugNames::ValueIterator::searchFromStartOfCurrentIndex() {
  for (const NameIndex *End = CurrentIndex->Section.NameIndices.end();
       CurrentIndex != End; ++CurrentIndex) {
    if (findInCurrentIndex())
      return;
  }
  setEnd();
}